

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall
dmlc::JSONObjectReadHelper::ReadAllFields(JSONObjectReadHelper *this,JSONReader *reader)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  ostream *poVar8;
  LogCheckError _check_err;
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  visited;
  ostringstream err;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  string local_3c8;
  JSONReader *local_3a8;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_360;
  string local_330 [3];
  ios_base local_2c0 [264];
  LogMessageFatal local_1b8;
  
  JSONReader::BeginObject(reader);
  local_360._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_360._M_impl.super__Rb_tree_header._M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8._M_string_length = 0;
  local_3c8.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->map_)._M_t._M_impl.super__Rb_tree_header;
  local_3a8 = reader;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right =
       local_360._M_impl.super__Rb_tree_header._M_header._M_left;
  while (bVar2 = JSONReader::NextObjectItem(reader,&local_3c8), bVar2) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
                    *)this,&local_3c8);
    if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"JSONReader: Unknown field ",0x1a);
      local_3a0 = local_390;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a0,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,(char *)local_3a0,local_398);
      if (local_3a0 != local_390) {
        operator_delete(local_3a0,local_390[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,", candidates are: \n",0x13);
      for (p_Var6 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        local_1b8._1_7_ = SUB87((ulong)local_1b8._0_8_ >> 8,0);
        local_1b8.log_stream_ = (ostringstream)0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,(char *)&local_1b8,1);
        local_380 = local_370;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,(char *)local_380,local_378);
        if (local_380 != local_370) {
          operator_delete(local_380,local_370[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\"\n",2);
      }
      LogMessageFatal::LogMessageFatal
                (&local_1b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x3d3);
      reader = local_3a8;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8,(char *)local_3e8,local_3e0);
      if (local_3e8 != local_3d8) {
        operator_delete(local_3e8,local_3d8[0] + 1);
      }
      LogMessageFatal::~LogMessageFatal(&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      std::ios_base::~ios_base(local_2c0);
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
               ::operator[](&this->map_,&local_3c8);
      (*pmVar4->func)(reader,pmVar4->addr);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_360,&local_3c8);
      *pmVar5 = 0;
    }
  }
  if ((local_360._M_impl.super__Rb_tree_header._M_node_count !=
       (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
     (p_Var6 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
     (_Rb_tree_header *)p_Var6 != p_Var1)) {
    do {
      if (*(char *)&p_Var6[2]._M_left == '\0') {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_360,(key_type *)(p_Var6 + 1));
        local_1b8._0_8_ =
             ZEXT18((_Rb_tree_header *)cVar7._M_node != &local_360._M_impl.super__Rb_tree_header);
        local_330[0]._M_dataplus._M_p._0_4_ = 0;
        LogCheck_NE<unsigned_long,unsigned_int>
                  ((dmlc *)&local_3e8,(unsigned_long *)&local_1b8,(uint *)local_330);
        if (local_3e8 != (long *)0x0) {
          LogMessageFatal::LogMessageFatal
                    (&local_1b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                     ,0x3df);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b8,"Check failed: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b8,"visited.count(it->first) != 0U",0x1e);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1b8,(char *)*local_3e8,local_3e8[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"JSONReader: Missing field \"",0x1b);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n At ",6);
          JSONReader::line_info_abi_cxx11_(local_330,local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,(char *)CONCAT44(local_330[0]._M_dataplus._M_p._4_4_,
                                             local_330[0]._M_dataplus._M_p._0_4_),
                     local_330[0]._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_330[0]._M_dataplus._M_p._4_4_,local_330[0]._M_dataplus._M_p._0_4_)
              != &local_330[0].field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_330[0]._M_dataplus._M_p._4_4_,
                                     local_330[0]._M_dataplus._M_p._0_4_),
                            local_330[0].field_2._M_allocated_capacity + 1);
          }
          LogMessageFatal::~LogMessageFatal(&local_1b8);
        }
        LogCheckError::~LogCheckError((LogCheckError *)&local_3e8);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT71(local_3c8.field_2._M_allocated_capacity._1_7_,
                             local_3c8.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_360);
  return;
}

Assistant:

inline void JSONObjectReadHelper::ReadAllFields(JSONReader *reader) {
  reader->BeginObject();
  std::map<std::string, int> visited;
  std::string key;
  while (reader->NextObjectItem(&key)) {
    if (map_.count(key) != 0) {
      Entry e = map_[key];
      (*e.func)(reader, e.addr);
      visited[key] = 0;
    } else {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      std::ostringstream err;
#else
      std::string err("");
#endif
      Extend(&err, "JSONReader: Unknown field ");
      Extend(&err, key);
      Extend(&err, ", candidates are: \n");
      for (std::map<std::string, Entry>::iterator
               it = map_.begin();
           it != map_.end(); ++it) {
        Extend(&err, '\"');
        Extend(&err, it->first);
        Extend(&err, "\"\n");
      }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      LOG(FATAL) << err.str();
#else
      LOG(FATAL) << err;
#endif
    }
  }
  if (visited.size() != map_.size()) {
    for (std::map<std::string, Entry>::iterator
             it = map_.begin();
         it != map_.end(); ++it) {
      if (it->second.optional)
        continue;
      CHECK_NE(visited.count(it->first), 0U)
          << "JSONReader: Missing field \"" << it->first << "\"\n At "
          << reader->line_info();
    }
  }
}